

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

size_t __thiscall SQASTWriter::writeAST(SQASTWriter *this,RootBlock *root,SQChar *sourcename)

{
  SQASTWriter *this_00;
  uint64_t v;
  SQASTWritingVisitor *this_01;
  ArenaVector<const_char_*> *in_RDI;
  size_t stringTableOff;
  size_t stringTableOffsetOff;
  SQASTWritingVisitor writingVisitor;
  size_t sourceNameOff;
  SQASTWriter *in_stack_ffffffffffffff40;
  SQASTWritingVisitor *in_stack_ffffffffffffff48;
  Arena *arena;
  SQASTWritingVisitor *in_stack_ffffffffffffff68;
  uint64_t uVar1;
  SQASTWritingVisitor *in_stack_ffffffffffffff70;
  SQASTWriter *this_02;
  Arena local_78 [2];
  undefined8 local_20;
  
  (*(code *)in_RDI->_arena->_chunks[1]._next)(in_RDI->_arena,0);
  writeMagic(in_stack_ffffffffffffff40);
  writeOptions(in_stack_ffffffffffffff40);
  local_20 = (*(code *)in_RDI->_arena->_chunks->_size)();
  arena = local_78;
  SQASTWritingVisitor::SQASTWritingVisitor
            (in_stack_ffffffffffffff70,(OutputStream *)in_stack_ffffffffffffff68,arena,in_RDI);
  SQASTWritingVisitor::writeString(in_stack_ffffffffffffff68,(SQChar *)arena);
  this_00 = (SQASTWriter *)(*(code *)in_RDI->_arena->_chunks->_size)();
  this_02 = this_00;
  OutputStream::writeRawUInt64((OutputStream *)this_00,(uint64_t)in_stack_ffffffffffffff48);
  SQCompilation::Node::visit<SQASTWritingVisitor>((Node *)this_00,in_stack_ffffffffffffff48);
  v = (*(code *)in_RDI->_arena->_chunks->_size)();
  uVar1 = v;
  (*(code *)in_RDI->_arena->_chunks[1]._next)(in_RDI->_arena,this_02);
  OutputStream::writeRawUInt64((OutputStream *)this_00,v);
  (*(code *)in_RDI->_arena->_chunks[1]._next)(in_RDI->_arena,uVar1);
  writeStringTable(this_02);
  this_01 = (SQASTWritingVisitor *)(*(code *)in_RDI->_arena->_chunks->_size)();
  SQASTWritingVisitor::~SQASTWritingVisitor(this_01);
  return (size_t)this_01;
}

Assistant:

size_t SQASTWriter::writeAST(RootBlock *root, const SQChar *sourcename) {
  stream->seek(0);

  writeMagic();

  assert(stream->pos() == sizeof(uint32_t));

  writeOptions();

  assert(stream->pos() == 2 * sizeof(uint32_t));

  size_t sourceNameOff = stream->pos();

  SQASTWritingVisitor writingVisitor(stream, &arena, stringIndexes);
  writingVisitor.writeString(sourcename);

  size_t stringTableOffsetOff = stream->pos();
  stream->writeRawUInt64(0);

  root->visit(&writingVisitor);

  size_t stringTableOff = stream->pos();

  stream->seek(stringTableOffsetOff);
  stream->writeRawUInt64(stringTableOff);

  stream->seek(stringTableOff);
  writeStringTable();

  return stream->pos();
}